

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O1

void receive_gui_job(void)

{
  char cVar1;
  char *__s2;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  bool key_pressed [2];
  char match_buffer [20];
  char buffer [100000];
  byte abStack_18702 [2];
  char *pcStack_18700;
  char acStack_186f8 [32];
  char acStack_186d8 [100008];
  
  abStack_18702[0] = 0;
  abStack_18702[1] = 0;
  acStack_186f8[0] = '\0';
  acStack_186f8[1] = '\0';
  acStack_186f8[2] = '\0';
  acStack_186f8[3] = '\0';
  acStack_186f8[4] = '\0';
  acStack_186f8[5] = '\0';
  acStack_186f8[6] = '\0';
  acStack_186f8[7] = '\0';
  acStack_186f8[8] = '\0';
  acStack_186f8[9] = '\0';
  acStack_186f8[10] = '\0';
  acStack_186f8[0xb] = '\0';
  acStack_186f8[0xc] = '\0';
  acStack_186f8[0xd] = '\0';
  acStack_186f8[0xe] = '\0';
  acStack_186f8[0xf] = '\0';
  acStack_186f8[0x10] = '\0';
  acStack_186f8[0x11] = '\0';
  acStack_186f8[0x12] = '\0';
  acStack_186f8[0x13] = '\0';
  uVar7 = 0;
  while ((sVar3 = recv(servers[1].socket,acStack_186d8,100000,0), sVar3 != 0 ||
         (piVar4 = __errno_location(), *piVar4 == 0))) {
    if (0 < sVar3) {
      pcStack_18700 = acStack_186d8 + sVar3;
      pcVar5 = acStack_186d8;
      do {
        cVar1 = *pcVar5;
        if (uVar7 < 0x14 && cVar1 != '\n') {
          acStack_186f8[uVar7] = cVar1;
          uVar7 = uVar7 + 1;
        }
        if ((cVar1 == '\n') && (uVar7 - 0xb < 5)) {
          piVar4 = &DAT_0010c9c8;
          uVar6 = 0;
          do {
            __s2 = *(char **)(piVar4 + -2);
            iVar2 = strncmp(acStack_186f8,__s2,(long)*piVar4);
            if (iVar2 == 0) {
              fprintf(_stderr,"GUI recv: %s\n",__s2);
              abStack_18702[uVar6 >> 1] = (byte)uVar6 & 1;
            }
            uVar6 = uVar6 + 1;
            piVar4 = piVar4 + 4;
          } while (uVar6 != 4);
        }
        if (*pcVar5 == '\n') {
          acStack_186f8[0] = '\0';
          acStack_186f8[1] = '\0';
          acStack_186f8[2] = '\0';
          acStack_186f8[3] = '\0';
          acStack_186f8[4] = '\0';
          acStack_186f8[5] = '\0';
          acStack_186f8[6] = '\0';
          acStack_186f8[7] = '\0';
          acStack_186f8[8] = '\0';
          acStack_186f8[9] = '\0';
          acStack_186f8[10] = '\0';
          acStack_186f8[0xb] = '\0';
          acStack_186f8[0xc] = '\0';
          acStack_186f8[0xd] = '\0';
          acStack_186f8[0xe] = '\0';
          acStack_186f8[0xf] = '\0';
          acStack_186f8[0x10] = '\0';
          acStack_186f8[0x11] = '\0';
          acStack_186f8[0x12] = '\0';
          acStack_186f8[0x13] = '\0';
          uVar7 = 0;
        }
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 < pcStack_18700);
    }
    turn_direction = abStack_18702[0] - abStack_18702[1];
  }
  perror("Connection to GUI failed");
  exit(1);
}

Assistant:

void receive_gui_job()
{
	bool key_pressed[2] = { false, false };
	
	constexpr std::pair<const char*, int> messages[] = {
		std::make_pair("LEFT_KEY_UP", sizeof("LEFT_KEY_UP")),
		std::make_pair("LEFT_KEY_DOWN", sizeof("LEFT_KEY_DOWN")),
		std::make_pair("RIGHT_KEY_UP", sizeof("RIGHT_KEY_UP")),
		std::make_pair("RIGHT_KEY_DOWN", sizeof("RIGHT_KEY_DOWN"))
	};

	constexpr int BUFFER_SIZE = 100000;
	char buffer[BUFFER_SIZE];
	// Since proper messages are newline-separated and TCP operates on stream of data,
	// copy first 16 signs and match the message
	char match_buffer[20] = { 0 };
	size_t msg_len = 0;

	while (true)
	{
		ssize_t read_len = recv(gui_server.socket, buffer, BUFFER_SIZE, 0);
		if (read_len == 0 && errno != 0)
		{
			std::perror("Connection to GUI failed");
			std::exit(1); // TODO: Verify that client exits
		}

		const char* pointer = buffer;
		while (pointer < buffer + read_len)
		{
			if (*pointer != '\n' && msg_len < sizeof(match_buffer))
			{
				match_buffer[msg_len] = *pointer;
				msg_len++;
			}
			// End of message and current message length in valid range (to avoid needless checks), check for message
			if (*pointer == '\n' && msg_len >= sizeof("LEFT_KEY_UP") - 1 && msg_len <= sizeof("RIGHT_KEY_DOWN"))
			{
				for (size_t i = 0; i < sizeof(messages) / sizeof(messages[0]); ++i)
				{
					// Directly map messages to the keys and values (pair of LEFT/RIGHT and UP/DOWN)
					if (strncmp(match_buffer, messages[i].first, messages[i].second) == 0)
					{
						fprintf(stderr, "GUI recv: %s\n", messages[i].first);
						key_pressed[i / 2] = (i % 2);
					}
				}
			}
			// Reset matching buffer, since every valid message is separated by newlines
			if (*pointer == '\n')
			{
				memset(match_buffer, 0x00, sizeof(match_buffer));
				msg_len = 0;
			}
			pointer++;
		}
		// Update turn direction after change
		turn_direction = (1 * key_pressed[0]) + (-1 * key_pressed[1]);
	}
}